

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_scan_avx2_256_8.c
# Opt level: O1

parasail_result_t *
parasail_nw_rowcol_scan_profile_avx2_256_8
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  ulong uVar1;
  longlong *plVar2;
  void *pvVar3;
  parasail_matrix_t *ppVar4;
  int *piVar5;
  undefined1 auVar6 [32];
  __m256i alVar7;
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  longlong lVar23;
  longlong lVar24;
  char cVar25;
  int iVar26;
  int iVar27;
  parasail_result_t *ppVar28;
  __m256i *ptr;
  int8_t *ptr_00;
  __m256i *ptr_01;
  __m256i *ptr_02;
  __m256i *ptr_03;
  byte bVar29;
  uint uVar30;
  int iVar31;
  int iVar32;
  ulong uVar33;
  __m256i *palVar34;
  int32_t segNum;
  int iVar35;
  int iVar36;
  ulong size;
  long lVar37;
  int8_t iVar38;
  uint uVar39;
  long lVar40;
  long lVar41;
  ulong uVar42;
  long lVar43;
  int iVar44;
  undefined1 uVar45;
  char cVar46;
  undefined1 auVar47 [16];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [16];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  __m256i_8_t e;
  __m256i_8_t h;
  longlong local_a0;
  longlong lStack_98;
  longlong lStack_90;
  longlong lStack_88;
  longlong local_80;
  longlong lStack_78;
  longlong lStack_70;
  longlong lStack_68;
  undefined1 auVar48 [32];
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_nw_rowcol_scan_profile_avx2_256_8_cold_8();
  }
  else {
    pvVar3 = (profile->profile8).score;
    if (pvVar3 == (void *)0x0) {
      parasail_nw_rowcol_scan_profile_avx2_256_8_cold_7();
    }
    else {
      ppVar4 = profile->matrix;
      if (ppVar4 == (parasail_matrix_t *)0x0) {
        parasail_nw_rowcol_scan_profile_avx2_256_8_cold_6();
      }
      else {
        uVar39 = profile->s1Len;
        if ((int)uVar39 < 1) {
          parasail_nw_rowcol_scan_profile_avx2_256_8_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_nw_rowcol_scan_profile_avx2_256_8_cold_4();
        }
        else if (s2Len < 1) {
          parasail_nw_rowcol_scan_profile_avx2_256_8_cold_3();
        }
        else if (open < 0) {
          parasail_nw_rowcol_scan_profile_avx2_256_8_cold_2();
        }
        else if (gap < 0) {
          parasail_nw_rowcol_scan_profile_avx2_256_8_cold_1();
        }
        else {
          iVar26 = uVar39 - 1;
          size = (ulong)uVar39 + 0x1f >> 5;
          iVar35 = (int)size;
          iVar27 = iVar26 / iVar35;
          iVar31 = ppVar4->min;
          iVar44 = -open;
          uVar30 = (uint)(byte)-(char)iVar31;
          if (iVar31 != iVar44 && SBORROW4(iVar31,iVar44) == iVar31 + open < 0) {
            uVar30 = open;
          }
          cVar25 = '~' - (char)ppVar4->max;
          ppVar28 = parasail_result_new_rowcol1((uint)((ulong)uVar39 + 0x1f) & 0x7fffffe0,s2Len);
          if (ppVar28 != (parasail_result_t *)0x0) {
            ppVar28->flag = ppVar28->flag | 0x20140401;
            ptr = parasail_memalign___m256i(0x20,size);
            ptr_00 = parasail_memalign_int8_t(0x20,(ulong)(s2Len + 1));
            ptr_01 = parasail_memalign___m256i(0x20,size);
            ptr_02 = parasail_memalign___m256i(0x20,size);
            ptr_03 = parasail_memalign___m256i(0x20,size);
            if (ptr_03 != (__m256i *)0x0 &&
                ((ptr_02 != (__m256i *)0x0 && ptr_01 != (__m256i *)0x0) &&
                (ptr_00 != (int8_t *)0x0 && ptr != (__m256i *)0x0))) {
              iVar31 = s2Len + -1;
              iVar32 = 0x1f - iVar27;
              uVar45 = (undefined1)open;
              auVar53[1] = uVar45;
              auVar53[0] = uVar45;
              auVar53[2] = uVar45;
              auVar53[3] = uVar45;
              auVar53[4] = uVar45;
              auVar53[5] = uVar45;
              auVar53[6] = uVar45;
              auVar53[7] = uVar45;
              auVar53[8] = uVar45;
              auVar53[9] = uVar45;
              auVar53[10] = uVar45;
              auVar53[0xb] = uVar45;
              auVar53[0xc] = uVar45;
              auVar53[0xd] = uVar45;
              auVar53[0xe] = uVar45;
              auVar53[0xf] = uVar45;
              auVar53[0x10] = uVar45;
              auVar53[0x11] = uVar45;
              auVar53[0x12] = uVar45;
              auVar53[0x13] = uVar45;
              auVar53[0x14] = uVar45;
              auVar53[0x15] = uVar45;
              auVar53[0x16] = uVar45;
              auVar53[0x17] = uVar45;
              auVar53[0x18] = uVar45;
              auVar53[0x19] = uVar45;
              auVar53[0x1a] = uVar45;
              auVar53[0x1b] = uVar45;
              auVar53[0x1c] = uVar45;
              auVar53[0x1d] = uVar45;
              auVar53[0x1e] = uVar45;
              auVar53[0x1f] = uVar45;
              cVar46 = (char)gap;
              auVar54[1] = cVar46;
              auVar54[0] = cVar46;
              auVar54[2] = cVar46;
              auVar54[3] = cVar46;
              auVar54[4] = cVar46;
              auVar54[5] = cVar46;
              auVar54[6] = cVar46;
              auVar54[7] = cVar46;
              auVar54[8] = cVar46;
              auVar54[9] = cVar46;
              auVar54[10] = cVar46;
              auVar54[0xb] = cVar46;
              auVar54[0xc] = cVar46;
              auVar54[0xd] = cVar46;
              auVar54[0xe] = cVar46;
              auVar54[0xf] = cVar46;
              auVar54[0x10] = cVar46;
              auVar54[0x11] = cVar46;
              auVar54[0x12] = cVar46;
              auVar54[0x13] = cVar46;
              auVar54[0x14] = cVar46;
              auVar54[0x15] = cVar46;
              auVar54[0x16] = cVar46;
              auVar54[0x17] = cVar46;
              auVar54[0x18] = cVar46;
              auVar54[0x19] = cVar46;
              auVar54[0x1a] = cVar46;
              auVar54[0x1b] = cVar46;
              auVar54[0x1c] = cVar46;
              auVar54[0x1d] = cVar46;
              auVar54[0x1e] = cVar46;
              auVar54[0x1f] = cVar46;
              bVar29 = (char)uVar30 + 0x81;
              auVar47[1] = bVar29;
              auVar47[0] = bVar29;
              auVar47[2] = bVar29;
              auVar47[3] = bVar29;
              auVar47[4] = bVar29;
              auVar47[5] = bVar29;
              auVar47[6] = bVar29;
              auVar47[7] = bVar29;
              auVar47[8] = bVar29;
              auVar47[9] = bVar29;
              auVar47[10] = bVar29;
              auVar47[0xb] = bVar29;
              auVar47[0xc] = bVar29;
              auVar47[0xd] = bVar29;
              auVar47[0xe] = bVar29;
              auVar47[0xf] = bVar29;
              auVar48[0x10] = bVar29;
              auVar48._0_16_ = auVar47;
              auVar48[0x11] = bVar29;
              auVar48[0x12] = bVar29;
              auVar48[0x13] = bVar29;
              auVar48[0x14] = bVar29;
              auVar48[0x15] = bVar29;
              auVar48[0x16] = bVar29;
              auVar48[0x17] = bVar29;
              auVar48[0x18] = bVar29;
              auVar48[0x19] = bVar29;
              auVar48[0x1a] = bVar29;
              auVar48[0x1b] = bVar29;
              auVar48[0x1c] = bVar29;
              auVar48[0x1d] = bVar29;
              auVar48[0x1e] = bVar29;
              auVar48[0x1f] = bVar29;
              auVar49[1] = cVar25;
              auVar49[0] = cVar25;
              auVar49[2] = cVar25;
              auVar49[3] = cVar25;
              auVar49[4] = cVar25;
              auVar49[5] = cVar25;
              auVar49[6] = cVar25;
              auVar49[7] = cVar25;
              auVar49[8] = cVar25;
              auVar49[9] = cVar25;
              auVar49[10] = cVar25;
              auVar49[0xb] = cVar25;
              auVar49[0xc] = cVar25;
              auVar49[0xd] = cVar25;
              auVar49[0xe] = cVar25;
              auVar49[0xf] = cVar25;
              auVar49[0x10] = cVar25;
              auVar49[0x11] = cVar25;
              auVar49[0x12] = cVar25;
              auVar49[0x13] = cVar25;
              auVar49[0x14] = cVar25;
              auVar49[0x15] = cVar25;
              auVar49[0x16] = cVar25;
              auVar49[0x17] = cVar25;
              auVar49[0x18] = cVar25;
              auVar49[0x19] = cVar25;
              auVar49[0x1a] = cVar25;
              auVar49[0x1b] = cVar25;
              auVar49[0x1c] = cVar25;
              auVar49[0x1d] = cVar25;
              auVar49[0x1e] = cVar25;
              auVar49[0x1f] = cVar25;
              cVar25 = -((char)size * cVar46);
              auVar50[1] = cVar25;
              auVar50[0] = cVar25;
              auVar50[2] = cVar25;
              auVar50[3] = cVar25;
              auVar50[4] = cVar25;
              auVar50[5] = cVar25;
              auVar50[6] = cVar25;
              auVar50[7] = cVar25;
              auVar50[8] = cVar25;
              auVar50[9] = cVar25;
              auVar50[10] = cVar25;
              auVar50[0xb] = cVar25;
              auVar50[0xc] = cVar25;
              auVar50[0xd] = cVar25;
              auVar50[0xe] = cVar25;
              auVar50[0xf] = cVar25;
              auVar50[0x10] = cVar25;
              auVar50[0x11] = cVar25;
              auVar50[0x12] = cVar25;
              auVar50[0x13] = cVar25;
              auVar50[0x14] = cVar25;
              auVar50[0x15] = cVar25;
              auVar50[0x16] = cVar25;
              auVar50[0x17] = cVar25;
              auVar50[0x18] = cVar25;
              auVar50[0x19] = cVar25;
              auVar50[0x1a] = cVar25;
              auVar50[0x1b] = cVar25;
              auVar50[0x1c] = cVar25;
              auVar50[0x1d] = cVar25;
              auVar50[0x1e] = cVar25;
              auVar50[0x1f] = cVar25;
              auVar50 = vpand_avx2(auVar50,_DAT_008d48e0);
              auVar50 = vpaddsb_avx2(ZEXT132(bVar29),auVar50);
              lVar40 = (long)iVar44;
              uVar42 = 0;
              do {
                lVar37 = 0;
                lVar43 = lVar40;
                do {
                  uVar45 = 0x80;
                  if (-0x80 < lVar43) {
                    uVar45 = (undefined1)lVar43;
                  }
                  *(undefined1 *)((long)&local_80 + lVar37) = uVar45;
                  lVar41 = lVar43 - (ulong)(uint)open;
                  if (lVar41 < -0x7f) {
                    lVar41 = -0x80;
                  }
                  *(char *)((long)&local_a0 + lVar37) = (char)lVar41;
                  lVar37 = lVar37 + 1;
                  lVar43 = lVar43 - size * (uint)gap;
                } while (lVar37 != 0x20);
                palVar34 = ptr_02 + uVar42;
                (*palVar34)[0] = local_80;
                (*palVar34)[1] = lStack_78;
                (*palVar34)[2] = lStack_70;
                (*palVar34)[3] = lStack_68;
                palVar34 = ptr + uVar42;
                (*palVar34)[0] = local_a0;
                (*palVar34)[1] = lStack_98;
                (*palVar34)[2] = lStack_90;
                (*palVar34)[3] = lStack_88;
                uVar42 = uVar42 + 1;
                lVar40 = lVar40 - (ulong)(uint)gap;
              } while (uVar42 != size);
              *ptr_00 = '\0';
              uVar42 = 1;
              if (1 < s2Len) {
                uVar42 = (ulong)(uint)s2Len;
              }
              uVar33 = 0;
              do {
                iVar38 = -0x80;
                if (-0x80 < iVar44) {
                  iVar38 = (int8_t)iVar44;
                }
                ptr_00[uVar33 + 1] = iVar38;
                iVar44 = iVar44 - gap;
                uVar33 = uVar33 + 1;
              } while (uVar42 != uVar33);
              alVar7 = (__m256i)vpsubsb_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar53);
              palVar34 = ptr_03 + (iVar35 - 1U);
              uVar42 = size;
              do {
                *palVar34 = alVar7;
                alVar7 = (__m256i)vpsubsb_avx2((undefined1  [32])alVar7,auVar54);
                palVar34 = palVar34 + -1;
                iVar44 = (int)uVar42;
                uVar39 = iVar44 - 1;
                uVar42 = (ulong)uVar39;
              } while (uVar39 != 0 && 0 < iVar44);
              iVar44 = 1;
              if (1 < iVar32) {
                iVar44 = iVar32;
              }
              uVar42 = 1;
              if (1 < s2Len) {
                uVar42 = (ulong)(uint)s2Len;
              }
              lVar40 = (ulong)(iVar35 + (uint)(iVar35 == 0)) << 5;
              auVar51 = ZEXT3264(auVar48);
              auVar52 = ZEXT3264(auVar49);
              uVar33 = 0;
              do {
                iVar36 = ppVar4->mapper[(byte)s2[uVar33]];
                auVar8 = vpsubsb_avx2(auVar48,(undefined1  [32])*ptr_03);
                auVar55 = SUB3216(ptr_02[iVar35 - 1U],0);
                auVar56._0_16_ = ZEXT116(0) * auVar55 + ZEXT116(1) * auVar47;
                auVar56._16_16_ = ZEXT116(0) * auVar48._16_16_ + ZEXT116(1) * auVar55;
                auVar56 = vpalignr_avx2((undefined1  [32])ptr_02[iVar35 - 1U],auVar56,0xf);
                auVar55 = vpinsrb_avx(auVar56._0_16_,(uint)(byte)ptr_00[uVar33],0);
                auVar56 = vpblendd_avx2(auVar56,ZEXT1632(auVar55),0xf);
                lVar43 = 0;
                auVar6 = auVar48;
                do {
                  auVar57 = vpaddsb_avx2(auVar56,*(undefined1 (*) [32])
                                                  ((long)pvVar3 +
                                                  lVar43 + (long)iVar36 * size * 0x20));
                  auVar56 = *(undefined1 (*) [32])((long)*ptr_02 + lVar43);
                  auVar9 = vpsubsb_avx2(*(undefined1 (*) [32])((long)*ptr + lVar43),auVar54);
                  auVar10 = vpsubsb_avx2(auVar56,auVar53);
                  auVar9 = vpmaxsb_avx2(auVar9,auVar10);
                  auVar8 = vpaddsb_avx2(auVar8,*(undefined1 (*) [32])((long)*ptr_03 + lVar43));
                  auVar6 = vpmaxsb_avx2(auVar6,auVar8);
                  auVar8 = vpmaxsb_avx2(auVar9,auVar57);
                  *(undefined1 (*) [32])((long)*ptr + lVar43) = auVar9;
                  *(undefined1 (*) [32])((long)*ptr_01 + lVar43) = auVar8;
                  lVar43 = lVar43 + 0x20;
                } while (lVar40 != lVar43);
                auVar57._0_16_ = ZEXT116(0) * auVar8._0_16_ + ZEXT116(1) * auVar47;
                auVar57._16_16_ = ZEXT116(0) * auVar48._16_16_ + ZEXT116(1) * auVar8._0_16_;
                auVar56 = vpalignr_avx2(auVar8,auVar57,0xf);
                uVar1 = uVar33 + 1;
                auVar55 = vpinsrb_avx(auVar56._0_16_,(uint)(byte)ptr_00[uVar33 + 1],0);
                auVar8 = vpblendd_avx2(auVar56,ZEXT1632(auVar55),0xf);
                auVar56 = vpaddsb_avx2(auVar8,(undefined1  [32])*ptr_03);
                auVar56 = vpmaxsb_avx2(auVar6,auVar56);
                iVar36 = 0x1e;
                do {
                  auVar6 = vperm2i128_avx2(auVar56,auVar56,0x28);
                  auVar6 = vpalignr_avx2(auVar56,auVar6,0xf);
                  auVar6 = vpaddsb_avx2(auVar6,auVar50);
                  auVar56 = vpmaxsb_avx2(auVar56,auVar6);
                  iVar36 = iVar36 + -1;
                } while (iVar36 != 0);
                auVar6 = vperm2i128_avx2(auVar56,auVar56,0x28);
                auVar56 = vpalignr_avx2(auVar56,auVar6,0xf);
                auVar56 = vpaddsb_avx2(auVar56,ZEXT132(bVar29));
                auVar6 = vpmaxsb_avx2(auVar8,auVar56);
                lVar43 = 0;
                do {
                  auVar56 = vpsubsb_avx2(auVar56,auVar54);
                  auVar6 = vpsubsb_avx2(auVar6,auVar53);
                  auVar56 = vpmaxsb_avx2(auVar56,auVar6);
                  auVar6 = vpmaxsb_avx2(auVar56,*(undefined1 (*) [32])((long)*ptr_01 + lVar43));
                  *(undefined1 (*) [32])((long)*ptr_02 + lVar43) = auVar6;
                  auVar57 = vpminsb_avx2(auVar52._0_32_,auVar6);
                  auVar52 = ZEXT3264(auVar57);
                  auVar8 = vpmaxsb_avx2(auVar51._0_32_,auVar6);
                  auVar51 = ZEXT3264(auVar8);
                  lVar43 = lVar43 + 0x20;
                } while (lVar40 != lVar43);
                alVar7 = ptr_02[(uint)(iVar26 % iVar35)];
                cVar25 = alVar7[2]._7_1_;
                iVar36 = iVar44;
                if (iVar27 < 0x1f) {
                  do {
                    auVar56 = vperm2i128_avx2((undefined1  [32])alVar7,(undefined1  [32])alVar7,0x28
                                             );
                    alVar7 = (__m256i)vpalignr_avx2((undefined1  [32])alVar7,auVar56,0xf);
                    cVar25 = alVar7[2]._7_1_;
                    iVar36 = iVar36 + -1;
                  } while (iVar36 != 0);
                }
                ((ppVar28->field_4).rowcols)->score_row[uVar33] = (int)cVar25;
                uVar33 = uVar1;
              } while (uVar1 != uVar42);
              uVar42 = (ulong)(uint)(iVar35 * 4);
              uVar33 = 0;
              do {
                piVar5 = ((ppVar28->field_4).rowcols)->score_col;
                plVar2 = *ptr_02 + uVar33;
                lVar23 = *plVar2;
                cVar25 = *(char *)((long)plVar2 + 1);
                cVar46 = *(char *)((long)plVar2 + 2);
                cVar11 = *(char *)((long)plVar2 + 3);
                cVar12 = *(char *)((long)plVar2 + 4);
                cVar13 = *(char *)((long)plVar2 + 5);
                cVar14 = *(char *)((long)plVar2 + 6);
                cVar15 = *(char *)((long)plVar2 + 7);
                plVar2 = *ptr_02 + uVar33 + 2;
                lVar24 = *plVar2;
                cVar16 = *(char *)((long)plVar2 + 1);
                cVar17 = *(char *)((long)plVar2 + 2);
                cVar18 = *(char *)((long)plVar2 + 3);
                cVar19 = *(char *)((long)plVar2 + 4);
                cVar20 = *(char *)((long)plVar2 + 5);
                cVar21 = *(char *)((long)plVar2 + 6);
                cVar22 = *(char *)((long)plVar2 + 7);
                *(int *)((long)piVar5 + uVar33) = (int)(char)lVar23;
                *(int *)((long)piVar5 + uVar42 + uVar33) = (int)cVar25;
                *(int *)((long)piVar5 + (uint)(iVar35 * 8) + uVar33) = (int)cVar46;
                *(int *)((long)piVar5 + uVar42 * 3 + uVar33) = (int)cVar11;
                *(int *)((long)piVar5 + (uint)(iVar35 << 4) + uVar33) = (int)cVar12;
                *(int *)((long)piVar5 + uVar42 * 5 + uVar33) = (int)cVar13;
                *(int *)((long)piVar5 + (ulong)(uint)(iVar35 * 8) * 3 + uVar33) = (int)cVar14;
                *(int *)((long)piVar5 + size * 0x1c + uVar33) = (int)cVar15;
                *(int *)((long)piVar5 + size * 0x20 + uVar33) = (int)(char)lVar23;
                *(int *)((long)piVar5 + (ulong)(uint)(iVar35 * 4) * 9 + uVar33) = (int)cVar25;
                *(int *)((long)piVar5 + (ulong)(uint)(iVar35 * 8) * 5 + uVar33) = (int)cVar46;
                *(int *)((long)piVar5 + size * 0x2c + uVar33) = (int)cVar11;
                *(int *)((long)piVar5 + (ulong)(uint)(iVar35 << 4) * 3 + uVar33) = (int)cVar12;
                *(int *)((long)piVar5 + size * 0x34 + uVar33) = (int)cVar13;
                *(int *)((long)piVar5 + size * 0x38 + uVar33) = (int)cVar14;
                *(int *)((long)piVar5 + size * 0x3c + uVar33) = (int)cVar15;
                *(int *)((long)piVar5 + size * 0x40 + uVar33) = (int)(char)lVar24;
                *(int *)((long)piVar5 + size * 0x40 + (ulong)(uint)(iVar35 * 4) + uVar33) =
                     (int)cVar16;
                *(int *)((long)piVar5 + (ulong)(uint)(iVar35 * 8) * 9 + uVar33) = (int)cVar17;
                *(int *)((long)piVar5 + size * 0x4c + uVar33) = (int)cVar18;
                *(int *)((long)piVar5 + (ulong)(uint)(iVar35 << 4) * 5 + uVar33) = (int)cVar19;
                *(int *)((long)piVar5 + size * 0x54 + uVar33) = (int)cVar20;
                *(int *)((long)piVar5 + size * 0x58 + uVar33) = (int)cVar21;
                *(int *)((long)piVar5 + size * 0x5c + uVar33) = (int)cVar22;
                *(int *)((long)piVar5 + size * 0x60 + uVar33) = (int)(char)lVar24;
                *(int *)((long)piVar5 + size * 100 + uVar33) = (int)cVar16;
                *(int *)((long)piVar5 + size * 0x68 + uVar33) = (int)cVar17;
                *(int *)((long)piVar5 + size * 0x6c + uVar33) = (int)cVar18;
                *(int *)((long)piVar5 + size * 0x70 + uVar33) = (int)cVar19;
                *(int *)((long)piVar5 + size * 0x74 + uVar33) = (int)cVar20;
                *(int *)((long)piVar5 + size * 0x78 + uVar33) = (int)cVar21;
                *(int *)((long)piVar5 + size * 0x7c + uVar33) = (int)cVar22;
                uVar33 = uVar33 + 4;
              } while ((iVar35 + (uint)(iVar35 == 0)) * 4 != uVar33);
              alVar7 = ptr_02[(uint)(iVar26 % iVar35)];
              cVar25 = alVar7[2]._7_1_;
              if (iVar27 < 0x1f) {
                iVar27 = 1;
                if (1 < iVar32) {
                  iVar27 = iVar32;
                }
                do {
                  auVar50 = vperm2i128_avx2((undefined1  [32])alVar7,(undefined1  [32])alVar7,0x28);
                  alVar7 = (__m256i)vpalignr_avx2((undefined1  [32])alVar7,auVar50,0xf);
                  cVar25 = alVar7[2]._7_1_;
                  iVar27 = iVar27 + -1;
                } while (iVar27 != 0);
              }
              auVar50 = vpcmpgtb_avx2(auVar48,auVar57);
              auVar48 = vpcmpgtb_avx2(auVar8,auVar49);
              auVar50 = vpor_avx2(auVar48,auVar50);
              if ((((((((((((((((((((((((((((((((auVar50 >> 7 & (undefined1  [32])0x1) !=
                                                (undefined1  [32])0x0 ||
                                               (auVar50 >> 0xf & (undefined1  [32])0x1) !=
                                               (undefined1  [32])0x0) ||
                                              (auVar50 >> 0x17 & (undefined1  [32])0x1) !=
                                              (undefined1  [32])0x0) ||
                                             (auVar50 >> 0x1f & (undefined1  [32])0x1) !=
                                             (undefined1  [32])0x0) ||
                                            (auVar50 >> 0x27 & (undefined1  [32])0x1) !=
                                            (undefined1  [32])0x0) ||
                                           (auVar50 >> 0x2f & (undefined1  [32])0x1) !=
                                           (undefined1  [32])0x0) ||
                                          (auVar50 >> 0x37 & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0) ||
                                         (auVar50 >> 0x3f & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (auVar50 >> 0x47 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                       (auVar50 >> 0x4f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (auVar50 >> 0x57 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) ||
                                     (auVar50 >> 0x5f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                                    (auVar50 >> 0x67 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                   (auVar50 >> 0x6f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (auVar50 >> 0x77 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                  ) || SUB321(auVar50 >> 0x7f,0) != '\0') ||
                                (auVar50 >> 0x87 & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                               || (auVar50 >> 0x8f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar50 >> 0x97 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                             (auVar50 >> 0x9f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar50 >> 0xa7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           (auVar50 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar50 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar50 >> 0xbf,0) != '\0') ||
                        (auVar50 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar50 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar50 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (auVar50 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar50 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   (auVar50 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar50 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  auVar50[0x1f] < '\0') {
                *(byte *)&ppVar28->flag = (byte)ppVar28->flag | 0x40;
                cVar25 = '\0';
                iVar31 = 0;
                iVar26 = 0;
              }
              ppVar28->score = (int)cVar25;
              ppVar28->end_query = iVar26;
              ppVar28->end_ref = iVar31;
              parasail_free(ptr_03);
              parasail_free(ptr_02);
              parasail_free(ptr_01);
              parasail_free(ptr_00);
              parasail_free(ptr);
              return ppVar28;
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m256i* restrict pvP = NULL;
    __m256i* restrict pvE = NULL;
    int8_t* restrict boundary = NULL;
    __m256i* restrict pvHt = NULL;
    __m256i* restrict pvH = NULL;
    __m256i* restrict pvGapper = NULL;
    __m256i vGapO;
    __m256i vGapE;
    int8_t NEG_LIMIT = 0;
    int8_t POS_LIMIT = 0;
    __m256i vZero;
    int8_t score = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vNegInfFront;
    __m256i vSegLenXgap;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile8.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 32; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    pvP = (__m256i*)profile->profile8.score;
    vGapO = _mm256_set1_epi8(open);
    vGapE = _mm256_set1_epi8(gap);
    NEG_LIMIT = (-open < matrix->min ? INT8_MIN + open : INT8_MIN - matrix->min) + 1;
    POS_LIMIT = INT8_MAX - matrix->max - 1;
    vZero = _mm256_setzero_si256();
    score = NEG_LIMIT;
    vNegLimit = _mm256_set1_epi8(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi8(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInfFront = vZero;
    vNegInfFront = _mm256_insert_epi8_rpl(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm256_adds_epi8(vNegInfFront,
            _mm256_slli_si256_rpl(_mm256_set1_epi8(-segLen*gap), 1));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_BITS_8 | PARASAIL_FLAG_LANES_32;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE = parasail_memalign___m256i(32, segLen);
    boundary = parasail_memalign_int8_t(32, s2Len+1);
    pvHt= parasail_memalign___m256i(32, segLen);
    pvH = parasail_memalign___m256i(32, segLen);
    pvGapper = parasail_memalign___m256i(32, segLen);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!boundary) return NULL;
    if (!pvHt) return NULL;
    if (!pvH) return NULL;
    if (!pvGapper) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m256i_8_t h;
            __m256i_8_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT8_MIN ? INT8_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT8_MIN ? INT8_MIN : tmp;
            }
            _mm256_store_si256(&pvH[index], h.m);
            _mm256_store_si256(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT8_MIN ? INT8_MIN : tmp;
        }
    }

    {
        __m256i vGapper = _mm256_subs_epi8(vZero,vGapO);
        for (i=segLen-1; i>=0; --i) {
            _mm256_store_si256(pvGapper+i, vGapper);
            vGapper = _mm256_subs_epi8(vGapper, vGapE);
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vE;
        __m256i vHt;
        __m256i vF;
        __m256i vH;
        __m256i vHp;
        __m256i *pvW;
        __m256i vW;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm256_load_si256(pvH+(segLen-1));
        vHp = _mm256_slli_si256_rpl(vHp, 1);
        vHp = _mm256_insert_epi8_rpl(vHp, boundary[j], 0);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = _mm256_subs_epi8(vNegLimit, pvGapper[0]);
        vF = vNegLimit;
        for (i=0; i<segLen; ++i) {
            vH = _mm256_load_si256(pvH+i);
            vE = _mm256_load_si256(pvE+i);
            vW = _mm256_load_si256(pvW+i);
            vE = _mm256_max_epi8(
                    _mm256_subs_epi8(vE, vGapE),
                    _mm256_subs_epi8(vH, vGapO));
            vHp = _mm256_adds_epi8(vHp, vW);
            vF = _mm256_max_epi8(vF, _mm256_adds_epi8(vHt, pvGapper[i]));
            vHt = _mm256_max_epi8(vE, vHp);
            _mm256_store_si256(pvE+i, vE);
            _mm256_store_si256(pvHt+i, vHt);
            vHp = vH;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm256_slli_si256_rpl(vHt, 1);
        vHt = _mm256_insert_epi8_rpl(vHt, boundary[j+1], 0);
        vF = _mm256_max_epi8(vF, _mm256_adds_epi8(vHt, pvGapper[0]));
        for (i=0; i<segWidth-2; ++i) {
            __m256i vFt = _mm256_slli_si256_rpl(vF, 1);
            vFt = _mm256_adds_epi8(vFt, vSegLenXgap);
            vF = _mm256_max_epi8(vF, vFt);
        }

        /* calculate final H */
        vF = _mm256_slli_si256_rpl(vF, 1);
        vF = _mm256_adds_epi8(vF, vNegInfFront);
        vH = _mm256_max_epi8(vHt, vF);
        for (i=0; i<segLen; ++i) {
            vHt = _mm256_load_si256(pvHt+i);
            vF = _mm256_max_epi8(
                    _mm256_subs_epi8(vF, vGapE),
                    _mm256_subs_epi8(vH, vGapO));
            vH = _mm256_max_epi8(vHt, vF);
            _mm256_store_si256(pvH+i, vH);
            vSaturationCheckMin = _mm256_min_epi8(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm256_max_epi8(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
            arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
        } 


#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm256_load_si256(pvH + offset);
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 1);
            }
            result->rowcols->score_row[j] = (int8_t) _mm256_extract_epi8_rpl (vH, 31);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m256i vH = _mm256_load_si256(pvH+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* extract last value from the last column */
    {
        __m256i vH = _mm256_load_si256(pvH + offset);
        for (k=0; k<position; ++k) {
            vH = _mm256_slli_si256_rpl(vH, 1);
        }
        score = (int8_t) _mm256_extract_epi8_rpl (vH, 31);
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi8_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi8(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvGapper);
    parasail_free(pvH);
    parasail_free(pvHt);
    parasail_free(boundary);
    parasail_free(pvE);

    return result;
}